

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_instancenorm.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  long lVar2;
  uint64_t uVar3;
  uint uVar4;
  prng_rand_t *in_RDI;
  bool bVar5;
  Mat MStack_88;
  Mat local_48;
  
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar3 = 0x807685dc;
  for (lVar2 = 1; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    g_prng_rand_state.s[lVar2] = uVar3;
    uVar3 = uVar3 + 0x7fffffff;
  }
  lVar2 = 10000;
  while (bVar5 = lVar2 != 0, lVar2 = lVar2 + -1, bVar5) {
    prng_rand(in_RDI);
  }
  RandomMat(&local_48,6,4,2);
  iVar1 = test_instancenorm(&local_48,0.01);
  if (iVar1 == 0) {
    RandomMat(&MStack_88,3,3,8);
    iVar1 = test_instancenorm(&MStack_88,0.002);
    uVar4 = (uint)(iVar1 != 0);
    ncnn::Mat::~Mat(&MStack_88);
  }
  else {
    uVar4 = 1;
  }
  ncnn::Mat::~Mat(&local_48);
  return uVar4;
}

Assistant:

int main()
{
    SRAND(7767517);

    return 0
        || test_instancenorm_0()
        ;
}